

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

int Acb_ObjSetTravIdDiff(Acb_Ntk_t *p,int i,int d)

{
  int extraout_EAX;
  
  Acb_ObjTravIdDiff(p,i);
  Vec_IntWriteEntry(&p->vObjTrav,i,p->nObjTravs - d);
  return extraout_EAX;
}

Assistant:

static inline int            Acb_ObjSetTravIdDiff( Acb_Ntk_t * p, int i, int d )     { int r = Acb_ObjTravIdDiff(p, i);   Vec_IntWriteEntry(&p->vObjTrav, i, p->nObjTravs-d); return r;     }